

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menudef.cpp
# Opt level: O3

bool ReplaceMenu(FScanner *sc,FMenuDescriptor *desc)

{
  FMenuDescriptor *pFVar1;
  Node *pNVar2;
  Node *pNVar3;
  FName local_c;
  
  local_c.Index = (desc->mMenuName).Index;
  pNVar3 = MenuDescriptors.Nodes + (MenuDescriptors.Size - 1 & local_c.Index);
  do {
    pNVar2 = pNVar3;
    if ((pNVar2 == (Node *)0x0) || (pNVar2->Next == (Node *)0x1)) goto LAB_0031135d;
    pNVar3 = pNVar2->Next;
  } while ((pNVar2->Pair).Key.Index != local_c.Index);
  pFVar1 = (pNVar2->Pair).Value;
  if (pFVar1 != (FMenuDescriptor *)0x0) {
    if ((pFVar1->mClass != (PClass *)0x0) && (desc->mClass != pFVar1->mClass)) {
      FScanner::ScriptMessage
                (sc,"Tried to replace menu \'%s\' with a menu of different type",
                 FName::NameData.NameArray[local_c.Index].Text);
      return true;
    }
    (*pFVar1->_vptr_FMenuDescriptor[1])(pFVar1);
    local_c.Index = (desc->mMenuName).Index;
  }
LAB_0031135d:
  pNVar3 = TMap<FName,_FMenuDescriptor_*,_THashTraits<FName>,_TValueTraits<FMenuDescriptor_*>_>::
           GetNode(&MenuDescriptors,&local_c);
  (pNVar3->Pair).Value = desc;
  return false;
}

Assistant:

static bool ReplaceMenu(FScanner &sc, FMenuDescriptor *desc)
{
	FMenuDescriptor **pOld = MenuDescriptors.CheckKey(desc->mMenuName);
	if (pOld != NULL && *pOld != NULL) 
	{
		if (CheckCompatible(desc, *pOld))
		{
			delete *pOld;
		}
		else
		{
			sc.ScriptMessage("Tried to replace menu '%s' with a menu of different type", desc->mMenuName.GetChars());
			return true;
		}
	}
	MenuDescriptors[desc->mMenuName] = desc;
	return false;
}